

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::save_file(ConstPtr *image,string *filename)

{
  Exception *this;
  bool bVar1;
  allocator local_99;
  string local_98 [32];
  shared_ptr<const_core::Image<float>_> local_78 [2];
  string local_58 [32];
  string local_38 [8];
  string fext4;
  string *filename_local;
  ConstPtr *image_local;
  
  util::string::right(local_58,filename,4);
  util::string::lowercase(local_38,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,".pfm");
  if (!bVar1) {
    this = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"Output filetype not supported",&local_99);
    util::Exception::Exception(this,(string *)local_98);
    __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  std::shared_ptr<const_core::Image<float>_>::shared_ptr(local_78,image);
  save_pfm_file(local_78,filename);
  std::shared_ptr<const_core::Image<float>_>::~shared_ptr(local_78);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
save_file (FloatImage::ConstPtr image, std::string const& filename)
{

    using namespace util::string;
    std::string fext4 = lowercase(right(filename, 4));
    if (fext4 == ".pfm")
    {
        save_pfm_file(image, filename);
        return;
    }

    throw util::Exception("Output filetype not supported");
}